

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

BOOL __thiscall
Js::ArgumentsObject::GetEnumerator
          (ArgumentsObject *this,JavascriptStaticEnumerator *enumerator,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  BOOL BVar1;
  Recycler *alloc;
  ArgumentsObjectPrefixEnumerator *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&ArgumentsObjectPrefixEnumerator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5a962ea;
  data.filename._0_4_ = 0xe;
  data._32_8_ = enumeratorCache;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler,(TrackAllocData *)local_60);
  this_00 = (ArgumentsObjectPrefixEnumerator *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
  ArgumentsObjectPrefixEnumerator::ArgumentsObjectPrefixEnumerator
            (this_00,this,flags,requestContext);
  BVar1 = DynamicObject::GetEnumeratorWithPrefix
                    (&this->super_DynamicObject,(JavascriptEnumerator *)this_00,enumerator,flags,
                     requestContext,(EnumeratorCache *)data._32_8_);
  return BVar1;
}

Assistant:

BOOL ArgumentsObject::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        return GetEnumeratorWithPrefix(
            RecyclerNew(GetScriptContext()->GetRecycler(), ArgumentsObjectPrefixEnumerator, this, flags, requestContext),
            enumerator, flags, requestContext, enumeratorCache);
    }